

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_cv_posix.cpp
# Opt level: O0

void pstore::descriptor_condition_variable::make_non_blocking(int fd)

{
  int iVar1;
  int *piVar2;
  errno_erc local_18;
  errno_erc local_14;
  uint local_10;
  int local_c;
  int flags;
  int fd_local;
  
  local_c = fd;
  local_10 = fcntl(fd,3);
  if (local_10 == 0xffffffff) {
    piVar2 = __errno_location();
    errno_erc::errno_erc(&local_14,*piVar2);
    raise<pstore::errno_erc,char[6]>(local_14,(char (*) [6])"fcntl");
  }
  local_10 = local_10 | 0x800;
  iVar1 = fcntl(local_c,4,(ulong)local_10);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    errno_erc::errno_erc(&local_18,*piVar2);
    raise<pstore::errno_erc,char[6]>(local_18,(char (*) [6])"fcntl");
  }
  return;
}

Assistant:

void descriptor_condition_variable::make_non_blocking (int const fd) {
        int flags = ::fcntl (fd, F_GETFL); // NOLINT
        if (flags == -1) {
            raise (errno_erc{errno}, "fcntl");
        }
        flags |= O_NONBLOCK;
        if (::fcntl (fd, F_SETFL, flags) == -1) { // NOLINT
            raise (errno_erc{errno}, "fcntl");
        }
    }